

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O1

void __thiscall MeterPrivate::drawNeedle(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  int iVar1;
  uint uVar2;
  Spec SVar3;
  float fVar4;
  QRadialGradient gradient;
  QColor local_b8;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  undefined1 local_88 [12];
  int iStack_7c;
  
  uVar2 = this->radius;
  QPainter::save();
  local_88._0_8_ = (undefined8)this->radius;
  unique0x10000667 = (double)local_88._0_8_;
  QPainter::translate((QPointF *)painter);
  QPainter::rotate((params->scaleDegree * this->value) / (this->maxValue - this->minValue) +
                   params->startScaleAngle);
  QBrush::QBrush((QBrush *)&local_b8,&this->needleColor,1);
  QPen::QPen(SUB84((double)this->radius / 75.0,0),local_88,&local_b8,1,0x10,0x40);
  QPainter::setPen((QPen *)painter);
  local_98 = (double)uVar2 / 10.0;
  uStack_90 = 0;
  QPen::~QPen((QPen *)local_88);
  QBrush::~QBrush((QBrush *)&local_b8);
  local_a8 = local_98 + local_98;
  uStack_a0 = uStack_90;
  local_88._0_8_ = (ulong)(uint)(int)((double)this->radius - params->margin) << 0x20;
  stack0xffffffffffffff80 = (double)((ulong)(uint)(int)-local_a8 << 0x20);
  QPainter::drawLines((QLine *)painter,(int)local_88);
  QBrush::QBrush((QBrush *)local_88,&this->backgroundColor,1);
  QPainter::setBrush((QBrush *)painter);
  QBrush::~QBrush((QBrush *)local_88);
  QPainter::setPen((PenStyle)painter);
  SVar3 = (Spec)-local_98;
  local_88._4_4_ = SVar3;
  local_88._0_4_ = SVar3;
  iVar1 = (SVar3 - Rgb) + (int)local_a8;
  iStack_7c = iVar1;
  local_88._8_4_ = iVar1;
  QPainter::drawEllipse((QRect *)painter);
  QPainter::restore();
  QPainter::save();
  fVar4 = (float)QColor::redF();
  local_a8._0_4_ = fVar4;
  fVar4 = (float)QColor::greenF();
  local_a8._0_4_ = fVar4 + local_a8._0_4_;
  fVar4 = (float)QColor::blueF();
  local_a8 = (double)CONCAT44(local_a8._4_4_,fVar4 + local_a8._0_4_);
  local_88._0_8_ = (undefined8)this->radius;
  unique0x1000066f = (double)local_88._0_8_;
  QPainter::translate((QPointF *)painter);
  QRadialGradient::QRadialGradient((QRadialGradient *)local_88,0.0,0.0,local_98,local_98,local_98);
  if (1.0 <= local_a8._0_4_) {
    QGradient::setColorAt(1.0,(QColor *)local_88);
    QColor::QColor(&local_b8,transparent);
    QGradient::setColorAt(0.0,(QColor *)local_88);
  }
  else {
    QGradient::setColorAt(0.0,(QColor *)local_88);
    QColor::QColor(&local_b8,transparent);
    QGradient::setColorAt(1.0,(QColor *)local_88);
  }
  QBrush::QBrush((QBrush *)&local_b8,(QGradient *)local_88);
  QPainter::setBrush((QBrush *)painter);
  QBrush::~QBrush((QBrush *)&local_b8);
  QPainter::setPen((PenStyle)painter);
  local_b8.cspec = SVar3;
  local_b8.ct._0_4_ = SVar3;
  local_b8.ct._4_4_ = iVar1;
  local_b8._12_4_ = iVar1;
  QPainter::drawEllipse((QRect *)painter);
  QPainter::restore();
  QRadialGradient::~QRadialGradient((QRadialGradient *)local_88);
  return;
}

Assistant:

void
MeterPrivate::drawNeedle( QPainter & painter, DrawParams & params )
{
	const qreal r = radius / 10.0;

	painter.save();
	painter.translate( radius, radius );
	painter.rotate( params.startScaleAngle + params.scaleDegree * value / ( maxValue - minValue ) );
	painter.setPen( QPen( needleColor, radius / 75.0 ) );
	painter.drawLine( 0, radius - params.margin, 0, - ( r * 2.0 ) );
	painter.setBrush( backgroundColor );
	painter.setPen( Qt::NoPen );
	painter.drawEllipse( -r, -r, r * 2.0, r * 2.0 );
	painter.restore();

	painter.save();
	const auto c = backgroundColor.redF() + backgroundColor.greenF() + backgroundColor.blueF();
	painter.translate( radius, radius );
	QRadialGradient gradient( 0.0, 0.0, r, r, r );

	if( c < 1.0 )
	{
		gradient.setColorAt( 0.0, textColor );
		gradient.setColorAt( 1.0, Qt::transparent );
	}
	else
	{
		gradient.setColorAt( 1.0, textColor );
		gradient.setColorAt( 0.0, Qt::transparent );
	}

	painter.setBrush( gradient );
	painter.setPen( Qt::NoPen );
	painter.drawEllipse( -r, -r, r * 2.0, r * 2.0 );
	painter.restore();
}